

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetCompileDefinitions
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language)

{
  cmMakefile *this_00;
  PolicyStatus PVar1;
  char *pcVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  PolicyID id;
  bool debugOptions;
  allocator<char> local_319;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  linkInterfaceCompileDefinitionsEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  string local_2e0;
  cmLocalGenerator *local_2c0;
  string configPropName;
  cmListFileBacktrace local_298;
  string local_280;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueOptions;
  ostringstream e;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uniqueOptions._M_h._M_buckets = &uniqueOptions._M_h._M_single_bucket;
  uniqueOptions._M_h._M_bucket_count = 1;
  uniqueOptions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  uniqueOptions._M_h._M_element_count = 0;
  uniqueOptions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  uniqueOptions._M_h._M_rehash_policy._M_next_resize = 0;
  uniqueOptions._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"COMPILE_DEFINITIONS",(allocator<char> *)&e);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,this,&local_280,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  std::__cxx11::string::~string((string *)&local_280);
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_DEBUG_TARGET_PROPERTIES",(allocator<char> *)&configPropName);
  pcVar2 = cmMakefile::GetDefinition(this_00,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,pcVar2,(allocator<char> *)&configPropName);
    cmSystemTools::ExpandListArgument((string *)&e,&debugProperties,false);
    std::__cxx11::string::~string((string *)&e);
  }
  if (this->DebugCompileDefinitionsDone == false) {
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                      (debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"COMPILE_DEFINITIONS");
    debugOptions = _Var3._M_current !=
                   debugProperties.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    debugOptions = false;
  }
  if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
    this->DebugCompileDefinitionsDone = true;
  }
  processCompileDefinitions
            (this,&this->CompileDefinitionsEntries,__return_storage_ptr__,&uniqueOptions,&dagChecker
             ,config,debugOptions,language);
  linkInterfaceCompileDefinitionsEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkInterfaceCompileDefinitionsEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  linkInterfaceCompileDefinitionsEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"INTERFACE_COMPILE_DEFINITIONS",(allocator<char> *)&configPropName);
  AddInterfaceEntries(this,config,(string *)&e,&linkInterfaceCompileDefinitionsEntries);
  std::__cxx11::string::~string((string *)&e);
  if (config->_M_string_length == 0) goto LAB_002efbdc;
  cmsys::SystemTools::UpperCase((string *)&e,config);
  std::operator+(&configPropName,"COMPILE_DEFINITIONS_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
  std::__cxx11::string::~string((string *)&e);
  pcVar2 = GetProperty(this,&configPropName);
  if (pcVar2 != (char *)0x0) {
    PVar1 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0043,false);
    if (PVar1 != OLD) {
      if (PVar1 != WARN) goto LAB_002efbd2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2e0,(cmPolicies *)0x2b,id);
      std::operator<<((ostream *)&e,(string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      local_2c0 = this->LocalGenerator;
      std::__cxx11::stringbuf::str();
      cmLocalGenerator::IssueMessage(local_2c0,AUTHOR_WARNING,&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&e,pcVar2,&local_319);
    local_298.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_298.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2e0._M_dataplus._M_p = (pointer)CreateTargetPropertyEntry((string *)&e,&local_298,false);
    std::
    vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
    ::emplace_back<cmGeneratorTarget::TargetPropertyEntry*>
              ((vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
                *)&linkInterfaceCompileDefinitionsEntries,(TargetPropertyEntry **)&local_2e0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_298.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&e);
  }
LAB_002efbd2:
  std::__cxx11::string::~string((string *)&configPropName);
LAB_002efbdc:
  processCompileDefinitions
            (this,&linkInterfaceCompileDefinitionsEntries,__return_storage_ptr__,&uniqueOptions,
             &dagChecker,config,debugOptions,language);
  cmDeleteAll<std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>>
            (&linkInterfaceCompileDefinitionsEntries);
  std::
  _Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ::~_Vector_base(&linkInterfaceCompileDefinitionsEntries.
                   super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                 );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&debugProperties);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&uniqueOptions._M_h);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetCompileDefinitions(
  std::string const& config, std::string const& language) const
{
  std::vector<BT<std::string>> list;
  std::unordered_set<std::string> uniqueOptions;

  cmGeneratorExpressionDAGChecker dagChecker(this, "COMPILE_DEFINITIONS",
                                             nullptr, nullptr);

  std::vector<std::string> debugProperties;
  const char* debugProp =
    this->Makefile->GetDefinition("CMAKE_DEBUG_TARGET_PROPERTIES");
  if (debugProp) {
    cmSystemTools::ExpandListArgument(debugProp, debugProperties);
  }

  bool debugDefines = !this->DebugCompileDefinitionsDone &&
    std::find(debugProperties.begin(), debugProperties.end(),
              "COMPILE_DEFINITIONS") != debugProperties.end();

  if (this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    this->DebugCompileDefinitionsDone = true;
  }

  processCompileDefinitions(this, this->CompileDefinitionsEntries, list,
                            uniqueOptions, &dagChecker, config, debugDefines,
                            language);

  std::vector<cmGeneratorTarget::TargetPropertyEntry*>
    linkInterfaceCompileDefinitionsEntries;
  AddInterfaceEntries(this, config, "INTERFACE_COMPILE_DEFINITIONS",
                      linkInterfaceCompileDefinitionsEntries);
  if (!config.empty()) {
    std::string configPropName =
      "COMPILE_DEFINITIONS_" + cmSystemTools::UpperCase(config);
    const char* configProp = this->GetProperty(configPropName);
    if (configProp) {
      switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0043)) {
        case cmPolicies::WARN: {
          std::ostringstream e;
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0043);
          this->LocalGenerator->IssueMessage(MessageType::AUTHOR_WARNING,
                                             e.str());
          CM_FALLTHROUGH;
        }
        case cmPolicies::OLD: {
          linkInterfaceCompileDefinitionsEntries.push_back(
            CreateTargetPropertyEntry(configProp));
        } break;
        case cmPolicies::NEW:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::REQUIRED_IF_USED:
          break;
      }
    }
  }

  processCompileDefinitions(this, linkInterfaceCompileDefinitionsEntries, list,
                            uniqueOptions, &dagChecker, config, debugDefines,
                            language);

  cmDeleteAll(linkInterfaceCompileDefinitionsEntries);
  return list;
}